

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

apx_error_t apx_client_create(apx_client_t *self)

{
  adt_list_t *paVar1;
  apx_nodeManager_t *paVar2;
  apx_error_t aVar3;
  
  if (self == (apx_client_t *)0x0) {
    aVar3 = 1;
  }
  else {
    paVar1 = adt_list_new(apx_clientEventListener_vdelete);
    self->event_listeners = paVar1;
    if (paVar1 == (adt_list_t *)0x0) {
      aVar3 = 2;
    }
    else {
      aVar3 = 0;
      self->connection = (apx_clientConnection_t *)0x0;
      self->vm = (apx_vm_tag *)0x0;
      paVar2 = apx_nodeManager_new('\x01');
      self->node_manager = paVar2;
      self->is_connected = false;
      pthread_mutex_init((pthread_mutex_t *)&self->lock,(pthread_mutexattr_t *)0x0);
      pthread_mutex_init((pthread_mutex_t *)&self->event_listener_lock,(pthread_mutexattr_t *)0x0);
    }
  }
  return aVar3;
}

Assistant:

apx_error_t apx_client_create(apx_client_t *self)
{
   if( self != NULL )
   {
      self->event_listeners = adt_list_new(apx_clientEventListener_vdelete);
      if (self->event_listeners == 0)
      {
         return APX_MEM_ERROR;
      }
      self->connection = (apx_clientConnection_t*) NULL;
      self->vm = (apx_vm_t*) NULL;
      self->node_manager = apx_nodeManager_new(APX_CLIENT_MODE);
      self->is_connected = false;
      MUTEX_INIT(self->lock);
      MUTEX_INIT(self->event_listener_lock);
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}